

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnReloc
          (BinaryReaderObjdumpPrepass *this,RelocType type,Offset offset,Index index,uint32_t addend
          )

{
  BinarySection BVar1;
  ObjdumpState *this_00;
  uint32_t local_14;
  Index local_10;
  RelocType local_c;
  Offset local_8;
  
  BVar1 = (this->super_BinaryReaderObjdumpBase).reloc_section_;
  if (BVar1 == Data) {
    this_00 = (ObjdumpState *)
              &((this->super_BinaryReaderObjdumpBase).objdump_state_)->data_relocations;
  }
  else {
    if (BVar1 != Code) {
      return (Result)Ok;
    }
    this_00 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  }
  local_14 = addend;
  local_10 = index;
  local_c = type;
  local_8 = offset;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)this_00,&local_c,&local_8,&local_10,
             &local_14);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpPrepass::OnReloc(RelocType type,
                                           Offset offset,
                                           Index index,
                                           uint32_t addend) {
  BinaryReaderObjdumpBase::OnReloc(type, offset, index, addend);
  if (reloc_section_ == BinarySection::Code) {
    objdump_state_->code_relocations.emplace_back(type, offset, index, addend);
  } else if (reloc_section_ == BinarySection::Data) {
    objdump_state_->data_relocations.emplace_back(type, offset, index, addend);
  }
  return Result::Ok;
}